

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O3

void Fraig_FeedBackCheckTable(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t **ppFVar2;
  int iVar3;
  Fraig_NodeVec_t *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Fraig_Node_t *pFVar8;
  long lVar9;
  long lVar10;
  Fraig_Node_t *Entry;
  long lVar11;
  
  pFVar1 = p->pTableF;
  iVar3 = pFVar1->nBins;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      pFVar8 = pFVar1->pBins[lVar5];
      if (pFVar8 != (Fraig_Node_t *)0x0) {
        pFVar4 = p->vCones;
        do {
          pFVar4->nSize = 0;
          Entry = pFVar8;
          do {
            Fraig_NodeVecPush(p->vCones,Entry);
            Entry = Entry->pNextD;
          } while (Entry != (Fraig_Node_t *)0x0);
          pFVar4 = p->vCones;
          iVar3 = pFVar4->nSize;
          if (1 < iVar3) {
            lVar7 = 1;
            lVar9 = 0;
            do {
              lVar10 = lVar9 + 1;
              lVar6 = (long)iVar3;
              lVar11 = lVar7;
              if (lVar10 < lVar6) {
                do {
                  iVar3 = Fraig_CompareSimInfo
                                    (pFVar4->pArray[lVar9],pFVar4->pArray[lVar11],p->iWordStart,0);
                  if (iVar3 != 0) {
                    ppFVar2 = p->vCones->pArray;
                    printf("Nodes %d and %d have the same D simulation info.\n",
                           (ulong)(uint)ppFVar2[lVar9]->Num,(ulong)(uint)ppFVar2[lVar11]->Num);
                  }
                  lVar11 = lVar11 + 1;
                  pFVar4 = p->vCones;
                  iVar3 = pFVar4->nSize;
                } while ((int)lVar11 < iVar3);
                lVar6 = (long)iVar3;
              }
              lVar7 = lVar7 + 1;
              lVar9 = lVar10;
            } while (lVar10 < lVar6);
          }
          pFVar8 = pFVar8->pNextF;
        } while (pFVar8 != (Fraig_Node_t *)0x0);
        iVar3 = pFVar1->nBins;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  return;
}

Assistant:

void Fraig_FeedBackCheckTable( Fraig_Man_t * p )
{
    Fraig_HashTable_t * pT = p->pTableF;
    Fraig_Node_t * pEntF, * pEntD;
    int i, k, m, nPairs;

    nPairs = 0;
    for ( i = 0; i < pT->nBins; i++ )
    Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryD( pEntF, pEntD )
            Fraig_NodeVecPush( p->vCones, pEntD );
        if ( p->vCones->nSize == 1 )
            continue;
        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                if ( Fraig_CompareSimInfo( p->vCones->pArray[k], p->vCones->pArray[m], p->iWordStart, 0 ) )
                    printf( "Nodes %d and %d have the same D simulation info.\n", 
                        p->vCones->pArray[k]->Num, p->vCones->pArray[m]->Num );
                nPairs++;
            }   
    }
//    printf( "\nThe total of %d node pairs have been verified.\n", nPairs );
}